

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_symmetrizing.cc
# Opt level: O0

void __thiscall
sptk::DataSymmetrizing::DataSymmetrizing
          (DataSymmetrizing *this,int fft_length,InputOutputFormats input_format,
          InputOutputFormats output_format)

{
  bool bVar1;
  int iVar2;
  undefined4 in_ECX;
  InputOutputFormats in_EDX;
  InputOutputFormats format;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__DataSymmetrizing_00127cc8;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  *(InputOutputFormats *)((long)in_RDI + 0xc) = in_EDX;
  *(undefined4 *)(in_RDI + 2) = in_ECX;
  iVar2 = anon_unknown.dwarf_5ace::CalculateDataLength
                    ((anon_unknown_dwarf_5ace *)(ulong)*(uint *)(in_RDI + 1),
                     *(int *)((long)in_RDI + 0xc),in_EDX);
  *(int *)((long)in_RDI + 0x14) = iVar2;
  iVar2 = anon_unknown.dwarf_5ace::CalculateDataLength
                    ((anon_unknown_dwarf_5ace *)(ulong)*(uint *)(in_RDI + 1),*(int *)(in_RDI + 2),
                     format);
  *(int *)(in_RDI + 3) = iVar2;
  *(undefined1 *)((long)in_RDI + 0x1c) = 1;
  if ((((*(int *)(in_RDI + 1) < 2) || (bVar1 = IsEven(*(int *)(in_RDI + 1)), !bVar1)) ||
      (*(int *)((long)in_RDI + 0x14) == 0)) || (*(int *)(in_RDI + 3) == 0)) {
    *(undefined1 *)((long)in_RDI + 0x1c) = 0;
  }
  return;
}

Assistant:

DataSymmetrizing::DataSymmetrizing(int fft_length,
                                   InputOutputFormats input_format,
                                   InputOutputFormats output_format)
    : fft_length_(fft_length),
      input_format_(input_format),
      output_format_(output_format),
      input_length_(CalculateDataLength(fft_length_, input_format_)),
      output_length_(CalculateDataLength(fft_length_, output_format_)),
      is_valid_(true) {
  if (fft_length_ < 2 || !IsEven(fft_length_) || 0 == input_length_ ||
      0 == output_length_) {
    is_valid_ = false;
    return;
  }
}